

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQInteger SVar3;
  SQObjectValue x;
  long lVar4;
  SQLocalVarInfo *this;
  long lVar5;
  long local_f8;
  SQObjectPtr o;
  SQInteger nfunctions;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQObjectPtr name_1;
  SQLocalVarInfo lvi;
  SQObjectPtr name;
  SQObjectPtr sourcename;
  SQInteger ndefaultparams;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQUnsignedInteger type;
  SQObjectPtr proto;
  
  sourcename.super_SQObject._unVal.pTable = (SQTable *)0x0;
  sourcename.super_SQObject._type = OT_NULL;
  name.super_SQObject._unVal.pTable = (SQTable *)0x0;
  name.super_SQObject._type = OT_NULL;
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  o.super_SQObject._type = OT_NULL;
  bVar2 = CheckTag(v,read,up,0x50415254);
  if (bVar2) {
    bVar2 = ReadObject(v,up,read,&sourcename);
    if (bVar2) {
      bVar2 = ReadObject(v,up,read,&name);
      if (bVar2) {
        bVar2 = CheckTag(v,read,up,0x50415254);
        if (bVar2) {
          SVar3 = (*read)(up,&nliterals,8);
          if (SVar3 == 8) {
            SVar3 = (*read)(up,&nparameters,8);
            if (SVar3 == 8) {
              SVar3 = (*read)(up,&noutervalues,8);
              if (SVar3 == 8) {
                SVar3 = (*read)(up,&nlocalvarinfos,8);
                if (SVar3 == 8) {
                  SVar3 = (*read)(up,&nlineinfos,8);
                  if (SVar3 == 8) {
                    SVar3 = (*read)(up,&ndefaultparams,8);
                    if (SVar3 == 8) {
                      SVar3 = (*read)(up,&ninstructions,8);
                      if (SVar3 == 8) {
                        SVar3 = (*read)(up,&nfunctions,8);
                        if (SVar3 == 8) {
                          x.pFunctionProto =
                               Create(v->_sharedstate,ninstructions,nliterals,nparameters,nfunctions
                                      ,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
                          proto.super_SQObject._type = OT_FUNCPROTO;
                          proto.super_SQObject._unVal.pFunctionProto = x.pFunctionProto;
                          if ((SQFunctionProto *)x.pTable == (SQFunctionProto *)0x0) {
                            __assert_fail("_unVal.pTable",
                                          "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.h"
                                          ,0xed,"SQObjectPtr::SQObjectPtr(SQFunctionProto *)");
                          }
                          pSVar1 = &((x.pTable)->super_SQDelegable).super_SQCollectable.
                                    super_SQRefCounted._uiRef;
                          *pSVar1 = *pSVar1 + 1;
                          SQObjectPtr::operator=(&(x.pGenerator)->_closure,&sourcename);
                          SQObjectPtr::operator=(&(x.pOuter)->_value,&name);
                          bVar2 = CheckTag(v,read,up,0x50415254);
                          if (bVar2) {
                            if (0 < nliterals) {
                              lVar5 = 0;
                              lVar4 = 0;
                              do {
                                bVar2 = ReadObject(v,up,read,&o);
                                if (!bVar2) goto LAB_00154bb4;
                                SQObjectPtr::operator=
                                          ((SQObjectPtr *)
                                           ((long)&((*(SQObjectPtr **)&((x.pGenerator)->_ci)._ncalls
                                                    )->super_SQObject)._type + lVar5),&o);
                                lVar4 = lVar4 + 1;
                                lVar5 = lVar5 + 0x10;
                              } while (lVar4 < nliterals);
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            if (0 < nparameters) {
                              lVar5 = 0;
                              lVar4 = 0;
                              do {
                                bVar2 = ReadObject(v,up,read,&o);
                                if (!bVar2) goto LAB_00154bb4;
                                SQObjectPtr::operator=
                                          ((SQObjectPtr *)
                                           ((long)&((SQObject *)
                                                   &(((x.pGenerator)->_etraps)._vals)->_stackbase)->
                                                   _type + lVar5),&o);
                                lVar4 = lVar4 + 1;
                                lVar5 = lVar5 + 0x10;
                              } while (lVar4 < nparameters);
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            if (0 < noutervalues) {
                              lVar4 = 0;
                              local_f8 = 0;
                              do {
                                name_1.super_SQObject._unVal.pTable = (SQTable *)0x0;
                                name_1.super_SQObject._type = OT_NULL;
                                SVar3 = (*read)(up,&type,8);
                                if (SVar3 != 8) {
                                  SQVM::Raise_Error(v,
                                                  "io error, read function failure, the origin stream could be corrupted/trucated"
                                                  );
LAB_00154b92:
                                  this = (SQLocalVarInfo *)&name_1;
                                  goto LAB_00154baf;
                                }
                                bVar2 = ReadObject(v,up,read,&o);
                                if (!bVar2) goto LAB_00154b92;
                                bVar2 = ReadObject(v,up,read,&name_1);
                                if (!bVar2) goto LAB_00154b92;
                                SQOuterVar::SQOuterVar
                                          ((SQOuterVar *)&lvi,&name_1,&o,(SQOuterType)type);
                                SQOuterVar::operator=
                                          ((SQOuterVar *)
                                           ((long)&(x.pFunctionProto)->_outervalues->_type + lVar4),
                                           (SQOuterVar *)&lvi);
                                SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&lvi._end_op);
                                SQObjectPtr::~SQObjectPtr
                                          ((SQObjectPtr *)&lvi._name.super_SQObject._unVal);
                                SQObjectPtr::~SQObjectPtr(&name_1);
                                local_f8 = local_f8 + 1;
                                lVar4 = lVar4 + 0x28;
                              } while (local_f8 < noutervalues);
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            if (0 < nlocalvarinfos) {
                              local_f8 = 0;
                              lVar4 = 0;
                              do {
                                lvi._name.super_SQObject._type = OT_NULL;
                                lvi._end_op = 0;
                                lvi._pos = 0;
                                lvi._name.super_SQObject._unVal.pTable = (SQTable *)0x0;
                                lvi._start_op = 0;
                                bVar2 = ReadObject(v,up,read,&lvi._name);
                                if (!bVar2) {
LAB_00154baa:
                                  this = &lvi;
LAB_00154baf:
                                  SQObjectPtr::~SQObjectPtr(&this->_name);
                                  goto LAB_00154bb4;
                                }
                                SVar3 = (*read)(up,&lvi._pos,8);
                                if (SVar3 != 8) {
LAB_00154b99:
                                  SQVM::Raise_Error(v,
                                                  "io error, read function failure, the origin stream could be corrupted/trucated"
                                                  );
                                  goto LAB_00154baa;
                                }
                                SVar3 = (*read)(up,&lvi._start_op,8);
                                if (SVar3 != 8) goto LAB_00154b99;
                                SVar3 = (*read)(up,&lvi._end_op,8);
                                if (SVar3 != 8) goto LAB_00154b99;
                                SQLocalVarInfo::operator=
                                          ((SQLocalVarInfo *)
                                           ((long)&((((x.pGenerator)->_ci)._closure.super_SQObject.
                                                     _unVal.pTable)->super_SQDelegable).
                                                   super_SQCollectable.super_SQRefCounted.
                                                   _vptr_SQRefCounted + local_f8),&lvi);
                                SQObjectPtr::~SQObjectPtr(&lvi._name);
                                lVar4 = lVar4 + 1;
                                local_f8 = local_f8 + 0x28;
                              } while (lVar4 < nlocalvarinfos);
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            lVar4 = nlineinfos << 4;
                            if (lVar4 != 0) {
                              SVar3 = (*read)(up,*(SQLineInfo **)&((x.pGenerator)->_ci)._etraps,
                                              lVar4);
                              if (SVar3 == lVar4) goto LAB_001549c5;
                              goto LAB_00154bc8;
                            }
LAB_001549c5:
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            lVar4 = ndefaultparams << 3;
                            if (lVar4 != 0) {
                              SVar3 = (*read)(up,(x.pFunctionProto)->_defaultparams,lVar4);
                              if (SVar3 != lVar4) goto LAB_00154bc8;
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            lVar4 = ninstructions << 3;
                            if (lVar4 != 0) {
                              SVar3 = (*read)(up,(x.pFunctionProto)->_instructions,lVar4);
                              if (SVar3 != lVar4) goto LAB_00154bc8;
                            }
                            bVar2 = CheckTag(v,read,up,0x50415254);
                            if (!bVar2) goto LAB_00154bb4;
                            if (0 < nfunctions) {
                              lVar5 = 0;
                              lVar4 = 0;
                              do {
                                bVar2 = Load(v,up,read,&o);
                                if (!bVar2) goto LAB_00154bb4;
                                SQObjectPtr::operator=
                                          ((SQObjectPtr *)
                                           ((long)&(((SQObjectPtr *)
                                                    ((x.pGenerator)->_etraps)._allocated)->
                                                   super_SQObject)._type + lVar5),&o);
                                lVar4 = lVar4 + 1;
                                lVar5 = lVar5 + 0x10;
                              } while (lVar4 < nfunctions);
                            }
                            SVar3 = (*read)(up,&(x.pTable)->_usednodes,8);
                            if (SVar3 == 8) {
                              SVar3 = (*read)(up,&(x.pClosure)->_defaultparams,1);
                              if (SVar3 != 1) goto LAB_00154bc8;
                              SVar3 = (*read)(up,&((x.pGenerator)->_ci)._literals,8);
                              if (SVar3 != 8) goto LAB_00154bc8;
                              bVar2 = true;
                              SQObjectPtr::operator=(ret,x.pFunctionProto);
                            }
                            else {
LAB_00154bc8:
                              bVar2 = false;
                              SQVM::Raise_Error(v,
                                                "io error, read function failure, the origin stream could be corrupted/trucated"
                                               );
                            }
                          }
                          else {
LAB_00154bb4:
                            bVar2 = false;
                          }
                          SQObjectPtr::~SQObjectPtr(&proto);
                          goto LAB_00154b34;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          bVar2 = false;
          SQVM::Raise_Error(v,
                            "io error, read function failure, the origin stream could be corrupted/trucated"
                           );
          goto LAB_00154b34;
        }
      }
    }
  }
  bVar2 = false;
LAB_00154b34:
  SQObjectPtr::~SQObjectPtr(&o);
  SQObjectPtr::~SQObjectPtr(&name);
  SQObjectPtr::~SQObjectPtr(&sourcename);
  return bVar2;
}

Assistant:

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    SQInteger i, nliterals,nparameters;
    SQInteger noutervalues ,nlocalvarinfos ;
    SQInteger nlineinfos,ninstructions ,nfunctions,ndefaultparams ;
    SQObjectPtr sourcename, name;
    SQObjectPtr o;
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(ReadObject(v, up, read, sourcename));
    _CHECK_IO(ReadObject(v, up, read, name));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, &nliterals, sizeof(nliterals)));
    _CHECK_IO(SafeRead(v,read,up, &nparameters, sizeof(nparameters)));
    _CHECK_IO(SafeRead(v,read,up, &noutervalues, sizeof(noutervalues)));
    _CHECK_IO(SafeRead(v,read,up, &nlocalvarinfos, sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeRead(v,read,up, &nlineinfos, sizeof(nlineinfos)));
    _CHECK_IO(SafeRead(v,read,up, &ndefaultparams, sizeof(ndefaultparams)));
    _CHECK_IO(SafeRead(v,read,up, &ninstructions, sizeof(ninstructions)));
    _CHECK_IO(SafeRead(v,read,up, &nfunctions, sizeof(nfunctions)));


    SQFunctionProto *f = SQFunctionProto::Create(_opt_ss(v),ninstructions,nliterals,nparameters,
            nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
    SQObjectPtr proto = f; //gets a ref in case of failure
    f->_sourcename = sourcename;
    f->_name = name;

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0;i < nliterals; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_literals[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nparameters; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_parameters[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < noutervalues; i++){
        SQUnsignedInteger type;
        SQObjectPtr name;
        _CHECK_IO(SafeRead(v,read,up, &type, sizeof(SQUnsignedInteger)));
        _CHECK_IO(ReadObject(v, up, read, o));
        _CHECK_IO(ReadObject(v, up, read, name));
        f->_outervalues[i] = SQOuterVar(name,o, (SQOuterType)type);
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nlocalvarinfos; i++){
        SQLocalVarInfo lvi;
        _CHECK_IO(ReadObject(v, up, read, lvi._name));
        _CHECK_IO(SafeRead(v,read,up, &lvi._pos, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._start_op, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._end_op, sizeof(SQUnsignedInteger)));
        f->_localvarinfos[i] = lvi;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_lineinfos, sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_defaultparams, sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_instructions, sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    for(i = 0; i < nfunctions; i++){
        _CHECK_IO(_funcproto(o)->Load(v, up, read, o));
        f->_functions[i] = o;
    }
    _CHECK_IO(SafeRead(v,read,up, &f->_stacksize, sizeof(f->_stacksize)));
    _CHECK_IO(SafeRead(v,read,up, &f->_bgenerator, sizeof(f->_bgenerator)));
    _CHECK_IO(SafeRead(v,read,up, &f->_varparams, sizeof(f->_varparams)));

    ret = f;
    return true;
}